

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O2

void __thiscall duckdb::CSVSniffFunctionData::~CSVSniffFunctionData(CSVSniffFunctionData *this)

{
  (this->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__CSVSniffFunctionData_027b3240;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->names_csv);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&(this->return_types_csv).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  CSVReaderOptions::~CSVReaderOptions(&this->options);
  ::std::__cxx11::string::~string((string *)&this->path);
  TableFunctionData::~TableFunctionData(&this->super_TableFunctionData);
  return;
}

Assistant:

CSVSniffFunctionData() {
	}